

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::anon_unknown_0::ParseErrorTest_ReservedStandaloneMaxNotAllowed_Test::
~ParseErrorTest_ReservedStandaloneMaxNotAllowed_Test
          (ParseErrorTest_ReservedStandaloneMaxNotAllowed_Test *this)

{
  ParseErrorTest_ReservedStandaloneMaxNotAllowed_Test *this_local;
  
  ~ParseErrorTest_ReservedStandaloneMaxNotAllowed_Test(this);
  operator_delete(this,0xf0);
  return;
}

Assistant:

TEST_F(ParseErrorTest, ReservedStandaloneMaxNotAllowed) {
  ExpectHasErrors(
      "message Foo {\n"
      "  reserved max;\n"
      "}\n",
      "1:11: Reserved names must be string literals. (Only editions supports "
      "identifiers.)\n");
}